

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_skylight.cpp
# Opt level: O3

double __thiscall ON_Skylight::ShadowIntensity(ON_Skylight *this)

{
  ON_InternalXMLImpl *this_00;
  double dVar1;
  ON_XMLVariant local_200;
  ON_XMLVariant local_108;
  
  this_00 = &this->m_impl->super_ON_InternalXMLImpl;
  ::ON_XMLVariant::ON_XMLVariant(&local_108,1.0);
  ON_InternalXMLImpl::GetParameter
            (&local_200,this_00,L"render-content-manager-document/settings/sun",
             L"skylight-shadow-intensity",&local_108);
  dVar1 = ::ON_XMLVariant::AsDouble(&local_200);
  ::ON_XMLVariant::~ON_XMLVariant(&local_200);
  ::ON_XMLVariant::~ON_XMLVariant(&local_108);
  return dVar1;
}

Assistant:

double ON_Skylight::ShadowIntensity(void) const
{
  // ShadowIntensity is currently unused. See [SHADOW_INTENSITY_UNUSED]
  return m_impl->GetParameter(XMLPath(), ON_RDK_SUN_SKYLIGHT_SHADOW_INTENSITY, 1.0).AsDouble();
}